

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost89.c
# Opt level: O0

void mac_block(gost_ctx *c,byte *buffer,byte *block)

{
  word32 wVar1;
  word32 wVar2;
  uint uVar3;
  uint uVar4;
  long in_RDX;
  uint *in_RSI;
  gost_ctx *in_RDI;
  int i;
  word32 n2;
  word32 n1;
  int local_24;
  
  for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
    *(byte *)((long)in_RSI + (long)local_24) =
         *(byte *)((long)in_RSI + (long)local_24) ^ *(byte *)(in_RDX + local_24);
  }
  uVar3 = *in_RSI;
  uVar4 = in_RSI[1];
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[0] + in_RDI->mask[0]);
  wVar2 = f(in_RDI,(wVar1 ^ uVar4) + in_RDI->key[1] + in_RDI->mask[1]);
  uVar3 = wVar2 ^ uVar3;
  wVar2 = f(in_RDI,uVar3 + in_RDI->key[2] + in_RDI->mask[2]);
  uVar4 = wVar2 ^ wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[3] + in_RDI->mask[3]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[4] + in_RDI->mask[4]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[5] + in_RDI->mask[5]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[6] + in_RDI->mask[6]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[7] + in_RDI->mask[7]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[0] + in_RDI->mask[0]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[1] + in_RDI->mask[1]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[2] + in_RDI->mask[2]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[3] + in_RDI->mask[3]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[4] + in_RDI->mask[4]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[5] + in_RDI->mask[5]);
  uVar3 = wVar1 ^ uVar3;
  wVar1 = f(in_RDI,uVar3 + in_RDI->key[6] + in_RDI->mask[6]);
  uVar4 = wVar1 ^ uVar4;
  wVar1 = f(in_RDI,uVar4 + in_RDI->key[7] + in_RDI->mask[7]);
  uVar3 = wVar1 ^ uVar3;
  *(char *)in_RSI = (char)uVar3;
  *(char *)((long)in_RSI + 1) = (char)(uVar3 >> 8);
  *(char *)((long)in_RSI + 2) = (char)(uVar3 >> 0x10);
  *(char *)((long)in_RSI + 3) = (char)(uVar3 >> 0x18);
  *(char *)(in_RSI + 1) = (char)uVar4;
  *(char *)((long)in_RSI + 5) = (char)(uVar4 >> 8);
  *(char *)((long)in_RSI + 6) = (char)(uVar4 >> 0x10);
  *(char *)((long)in_RSI + 7) = (char)(uVar4 >> 0x18);
  return;
}

Assistant:

void mac_block(gost_ctx * c, byte * buffer, const byte * block)
{
    register word32 n1, n2;     /* As named in the GOST */
    int i;
    for (i = 0; i < 8; i++) {
        buffer[i] ^= block[i];
    }
    n1 = buffer[0] | (buffer[1] << 8) | (buffer[2] << 16) | ((word32)
                                                             buffer[3] << 24);
    n2 = buffer[4] | (buffer[5] << 8) | (buffer[6] << 16) | ((word32)
                                                             buffer[7] << 24);
    /* Instead of swapping halves, swap names each round */

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    n2 ^= f(c, n1 + c->key[0] + c->mask[0]);
    n1 ^= f(c, n2 + c->key[1] + c->mask[1]);
    n2 ^= f(c, n1 + c->key[2] + c->mask[2]);
    n1 ^= f(c, n2 + c->key[3] + c->mask[3]);
    n2 ^= f(c, n1 + c->key[4] + c->mask[4]);
    n1 ^= f(c, n2 + c->key[5] + c->mask[5]);
    n2 ^= f(c, n1 + c->key[6] + c->mask[6]);
    n1 ^= f(c, n2 + c->key[7] + c->mask[7]);

    buffer[0] = (byte) (n1 & 0xff);
    buffer[1] = (byte) ((n1 >> 8) & 0xff);
    buffer[2] = (byte) ((n1 >> 16) & 0xff);
    buffer[3] = (byte) (n1 >> 24);
    buffer[4] = (byte) (n2 & 0xff);
    buffer[5] = (byte) ((n2 >> 8) & 0xff);
    buffer[6] = (byte) ((n2 >> 16) & 0xff);
    buffer[7] = (byte) (n2 >> 24);
}